

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_band.c
# Opt level: O0

int check_matrix(SUNMatrix A,SUNMatrix B,realtype tol)

{
  SUNMatrix_ID SVar1;
  SUNMatrix_ID SVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint local_bc;
  long local_b8;
  long local_a0;
  realtype *Bcolj;
  realtype *Acolj;
  sunindextype iend;
  sunindextype istart;
  sunindextype j;
  sunindextype i;
  int failure;
  realtype tol_local;
  SUNMatrix B_local;
  SUNMatrix A_local;
  
  i._4_4_ = 0;
  SVar1 = SUNMatGetID(A);
  SVar2 = SUNMatGetID(B);
  if (SVar1 == SVar2) {
    lVar3 = SUNBandMatrix_Columns(A);
    lVar4 = SUNBandMatrix_Columns(B);
    if (lVar3 == lVar4) {
      lVar3 = SUNBandMatrix_Rows(A);
      lVar4 = SUNBandMatrix_Rows(B);
      if (lVar3 == lVar4) {
        lVar3 = SUNBandMatrix_LowerBandwidth(A);
        lVar4 = SUNBandMatrix_LowerBandwidth(B);
        if (lVar3 == lVar4) {
          lVar3 = SUNBandMatrix_UpperBandwidth(A);
          lVar4 = SUNBandMatrix_UpperBandwidth(B);
          if (lVar3 == lVar4) {
            for (istart = 0; lVar3 = SUNBandMatrix_Columns(A), istart < lVar3; istart = istart + 1)
            {
              lVar3 = SUNBandMatrix_Column(A,istart);
              lVar4 = SUNBandMatrix_Column(B,istart);
              lVar5 = SUNBandMatrix_UpperBandwidth(A);
              local_a0 = istart;
              if (lVar5 <= istart) {
                local_a0 = SUNBandMatrix_UpperBandwidth(A);
              }
              local_a0 = -local_a0;
              lVar5 = SUNBandMatrix_Columns(A);
              lVar6 = SUNBandMatrix_LowerBandwidth(A);
              if ((lVar5 + -1) - lVar6 < istart) {
                lVar5 = SUNBandMatrix_Columns(A);
                local_b8 = (lVar5 + -1) - istart;
              }
              else {
                local_b8 = SUNBandMatrix_LowerBandwidth(A);
              }
              for (j = local_a0; j <= local_b8; j = j + 1) {
                if (NAN(*(double *)(lVar3 + j * 8))) {
                  local_bc = 1;
                }
                else {
                  local_bc = (uint)(tol < ABS(*(double *)(lVar3 + j * 8) -
                                              *(double *)(lVar4 + j * 8)) /
                                          ABS(*(double *)(lVar4 + j * 8)));
                }
                i._4_4_ = local_bc + i._4_4_;
              }
            }
            if (0.0 < (double)i._4_4_) {
              printf("check_matrix failure, A = \n");
              SUNBandMatrix_Print(A,_stdout);
              printf("B = \n");
              SUNBandMatrix_Print(B,_stdout);
            }
            if ((double)i._4_4_ <= 0.0) {
              A_local._4_4_ = 0;
            }
            else {
              A_local._4_4_ = 1;
            }
          }
          else {
            A_local._4_4_ = 1;
          }
        }
        else {
          A_local._4_4_ = 1;
        }
      }
      else {
        A_local._4_4_ = 1;
      }
    }
    else {
      A_local._4_4_ = 1;
    }
  }
  else {
    A_local._4_4_ = 1;
  }
  return A_local._4_4_;
}

Assistant:

int check_matrix(SUNMatrix A, SUNMatrix B, realtype tol)
{
  int failure = 0;
  sunindextype i, j, istart, iend;
  realtype *Acolj, *Bcolj;

  /* check matrix type and dimensions */
  if (SUNMatGetID(A) != SUNMatGetID(B))
    return 1;
  if (SUNBandMatrix_Columns(A) != SUNBandMatrix_Columns(B))
    return 1;
  if (SUNBandMatrix_Rows(A) != SUNBandMatrix_Rows(B))
    return 1;
  if (SUNBandMatrix_LowerBandwidth(A) != SUNBandMatrix_LowerBandwidth(B))
    return 1;
  if (SUNBandMatrix_UpperBandwidth(A) != SUNBandMatrix_UpperBandwidth(B))
    return 1;
  
  /* check matrix data */
  for (j=0; j<SUNBandMatrix_Columns(A); j++) {

    /* access matrix columns */
    Acolj = SUNBandMatrix_Column(A, j);
    Bcolj = SUNBandMatrix_Column(B, j);

    /* compare entries in this column */
    istart = (j<SUNBandMatrix_UpperBandwidth(A)) ? -j : -SUNBandMatrix_UpperBandwidth(A);
    iend = (j>SUNBandMatrix_Columns(A)-1-SUNBandMatrix_LowerBandwidth(A)) ?
      SUNBandMatrix_Columns(A)-1-j : SUNBandMatrix_LowerBandwidth(A);
    for (i=istart; i<=iend; i++)
      failure += FNEQ(Acolj[i], Bcolj[i], tol);
  }

  if (failure > ZERO) {
    printf("check_matrix failure, A = \n");
    SUNBandMatrix_Print(A, stdout);
    printf("B = \n");
    SUNBandMatrix_Print(B, stdout);
  }

    
  if (failure > ZERO)
    return(1);
  else
    return(0);
}